

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_slider.c
# Opt level: O0

void slider_orientation(t_slider *x,t_floatarg forient)

{
  int iVar1;
  short sVar2;
  t_iem_orientation tVar3;
  int w;
  int orient;
  t_floatarg forient_local;
  t_slider *x_local;
  
  tVar3 = (t_iem_orientation)((int)forient != 0);
  if (tVar3 != x->x_orientation) {
    iVar1 = (x->x_gui).x_w;
    (x->x_gui).x_w = (x->x_gui).x_h;
    (x->x_gui).x_h = iVar1;
    sVar2 = -1;
    if (tVar3 == horizontal) {
      sVar2 = 1;
    }
    (x->x_gui).x_obj.te_xpix = (x->x_gui).x_obj.te_xpix + sVar2 * 3;
    sVar2 = -1;
    if (tVar3 == horizontal) {
      sVar2 = 1;
    }
    (x->x_gui).x_obj.te_ypix = (x->x_gui).x_obj.te_ypix + sVar2 * -2;
  }
  x->x_orientation = tVar3;
  iemgui_size(x,&x->x_gui);
  return;
}

Assistant:

static void slider_orientation(t_slider *x, t_floatarg forient)
{
    int orient = !!(int)forient;
    if(orient != x->x_orientation)
    {
        int w = x->x_gui.x_w;
        x->x_gui.x_w = x->x_gui.x_h;
        x->x_gui.x_h = w;

            /* urgh. for historical reasons,
             * sliders have a different offset depending on their orientation.
             * for backwards-compatibility, an ideal solution would handle
             * these offsets during load/save,
             * but we cannot access the object position in the constructor,
             * so we need to do it here...
             */
        x->x_gui.x_obj.te_xpix += LMARGIN * ((horizontal==orient)?1:-1);
        x->x_gui.x_obj.te_ypix -= TMARGIN * ((horizontal==orient)?1:-1);
    }
    x->x_orientation = orient;

    iemgui_size(x, &x->x_gui);
}